

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 242_validAnagrams.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  string s2;
  string s;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  string local_68;
  string local_48;
  
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"anagram","");
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"naagram","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_88,local_80 + (long)local_88);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_a8,local_a0 + (long)local_a8);
  isAnagram(&local_48,&local_68);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return 0;
}

Assistant:

int main()
{
	string s="anagram",s2="naagram";
	cout<<isAnagram(s,s2)<<endl;
	return 0;
}